

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_samtools.c
# Opt level: O0

int bam_construct_seq(bam_seq_t **bp,size_t extra_len,char *qname,size_t qname_len,int flag,
                     int rname,int pos,int end,int mapq,uint32_t ncigar,uint32_t *cigar,int mrnm,
                     int mpos,int isize,int len,char *seq,char *qual)

{
  bam_seq_t *pbVar1;
  int iVar2;
  uint uVar3;
  uint8_t *puVar4;
  int local_4c;
  int bam_len;
  int i;
  uint8_t *cp;
  bam1_t *b;
  int rname_local;
  int flag_local;
  size_t qname_len_local;
  char *qname_local;
  size_t extra_len_local;
  bam_seq_t **bp_local;
  
  pbVar1 = *bp;
  iVar2 = (int)qname_len + 1 + ncigar * 4 + (len + 1) / 2 + len + (int)extra_len;
  if (pbVar1->m_data < iVar2) {
    pbVar1->m_data = iVar2;
    pbVar1->m_data = pbVar1->m_data + -1;
    pbVar1->m_data = pbVar1->m_data >> 1 | pbVar1->m_data;
    pbVar1->m_data = pbVar1->m_data >> 2 | pbVar1->m_data;
    pbVar1->m_data = pbVar1->m_data >> 4 | pbVar1->m_data;
    pbVar1->m_data = pbVar1->m_data >> 8 | pbVar1->m_data;
    pbVar1->m_data = pbVar1->m_data >> 0x10 | pbVar1->m_data;
    pbVar1->m_data = pbVar1->m_data + 1;
    puVar4 = (uint8_t *)realloc(pbVar1->data,(long)pbVar1->m_data);
    pbVar1->data = puVar4;
    if (pbVar1->data == (uint8_t *)0x0) {
      return -1;
    }
  }
  pbVar1->l_data = iVar2;
  (pbVar1->core).tid = rname;
  (pbVar1->core).pos = pos + -1;
  uVar3 = hts_reg2bin((long)pos,(long)end,0xe,5);
  *(ulong *)&(pbVar1->core).field_0x8 =
       *(ulong *)&(pbVar1->core).field_0x8 & 0xffffffffffff0000 | (ulong)uVar3 & 0xffff;
  *(ulong *)&(pbVar1->core).field_0x8 =
       *(ulong *)&(pbVar1->core).field_0x8 & 0xffffffffff00ffff | ((ulong)(uint)mapq & 0xff) << 0x10
  ;
  *(ulong *)&(pbVar1->core).field_0x8 =
       *(ulong *)&(pbVar1->core).field_0x8 & 0xffffffff00ffffff |
       ((ulong)((int)qname_len + 1) & 0xff) << 0x18;
  *(ulong *)&(pbVar1->core).field_0x8 =
       *(ulong *)&(pbVar1->core).field_0x8 & 0xffff0000ffffffff |
       ((ulong)(uint)flag & 0xffff) << 0x20;
  *(ulong *)&(pbVar1->core).field_0x8 =
       *(ulong *)&(pbVar1->core).field_0x8 & 0xffffffffffff | (ulong)ncigar << 0x30;
  (pbVar1->core).l_qseq = len;
  (pbVar1->core).mtid = mrnm;
  (pbVar1->core).mpos = mpos + -1;
  (pbVar1->core).isize = isize;
  puVar4 = pbVar1->data;
  strncpy((char *)puVar4,qname,qname_len);
  puVar4[qname_len] = '\0';
  memcpy(puVar4 + qname_len + 1,cigar,(ulong)(ncigar << 2));
  _bam_len = puVar4 + qname_len + 1 + (ncigar << 2);
  for (local_4c = 0; local_4c + 1 < len; local_4c = local_4c + 2) {
    *_bam_len = "\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f"
                [(byte)seq[local_4c]] * '\x10' +
                "\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f"
                [(byte)seq[local_4c + 1]];
    _bam_len = _bam_len + 1;
  }
  if (local_4c < len) {
    *_bam_len = "\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f"
                [(byte)seq[local_4c]] << 4;
    _bam_len = _bam_len + 1;
  }
  if (qual == (char *)0x0) {
    memset(_bam_len,0xff,(long)len);
  }
  else {
    memcpy(_bam_len,qual,(long)len);
  }
  return 0;
}

Assistant:

int bam_construct_seq(bam_seq_t **bp, size_t extra_len,
		      const char *qname, size_t qname_len,
		      int flag,
		      int rname,      // Ref ID
		      int pos,
		      int end,        // aligned start/end coords
		      int mapq,
		      uint32_t ncigar, const uint32_t *cigar,
		      int mrnm,       // Mate Ref ID
		      int mpos,
		      int isize,
		      int len,
		      const char *seq,
		      const char *qual) {
    static const char L[256] = {
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15, 0,15,15,
	15, 1,14, 2,13,15,15, 4,11,15,15,12,15, 3,15,15,
	15,15, 5, 6, 8,15, 7, 9,15,10,15,15,15,15,15,15,
	15, 1,14, 2,13,15,15, 4,11,15,15,12,15, 3,15,15,
	15,15, 5, 6, 8,15, 7, 9,15,10,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15
    };
    bam1_t *b = (bam1_t *)*bp;
    uint8_t *cp;
    int i, bam_len;

    //b->l_aux = extra_len; // we fill this out later

    bam_len = qname_len + 1 + ncigar*4 + (len+1)/2 + len + extra_len;
    if (b->m_data < bam_len) {
	b->m_data = bam_len;
	kroundup32(b->m_data);
	b->data = (uint8_t*)realloc(b->data, b->m_data);
	if (!b->data)
	    return -1;
    }
    b->l_data = bam_len;

    b->core.tid     = rname;
    b->core.pos     = pos-1;
    b->core.bin     = bam_reg2bin(pos, end);
    b->core.qual    = mapq;
    b->core.l_qname = qname_len+1;
    b->core.flag    = flag;
    b->core.n_cigar = ncigar;
    b->core.l_qseq  = len;
    b->core.mtid    = mrnm;
    b->core.mpos    = mpos-1;
    b->core.isize   = isize;

    cp = b->data;

    strncpy((char *)cp, qname, qname_len);
    cp[qname_len] = 0;
    cp += qname_len+1;
    memcpy(cp, cigar, ncigar*4);
    cp += ncigar*4;

    for (i = 0; i+1 < len; i+=2) {
	*cp++ = (L[(uc)seq[i]]<<4) + L[(uc)seq[i+1]];
    }
    if (i < len)
	*cp++ = L[(uc)seq[i]]<<4;

    if (qual)
	memcpy(cp, qual, len);
    else
	memset(cp, '\xff', len);

    return 0;
}